

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eigenproblem_solvers.cpp
# Opt level: O1

Vector<float> __thiscall
geometrycentral::largestEigenvector<float>
          (geometrycentral *this,SparseMatrix<float> *energyMatrix,SparseMatrix<float> *massMatrix,
          size_t nIterations)

{
  float *pfVar1;
  undefined8 *puVar2;
  long lVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  Index IVar11;
  int iVar12;
  Index extraout_RDX;
  ActualDstType actualDst;
  ulong uVar13;
  long lVar14;
  LhsNested lhsNested;
  Index othersize;
  size_t sVar15;
  Vector<float> VVar16;
  Vector<float> u;
  PositiveDefiniteSolver<float> solver;
  DenseStorage<float,__1,__1,_1,_0> local_88;
  PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> local_78;
  float local_5c;
  size_t local_58;
  PositiveDefiniteSolver<float> local_50;
  
  uVar13 = massMatrix->m_innerSize;
  local_58 = nIterations;
  PositiveDefiniteSolver<float>::PositiveDefiniteSolver(&local_50,massMatrix);
  local_88.m_data = (float *)0x0;
  local_88.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)&local_88,uVar13,1);
  if (local_88.m_rows != uVar13) {
    Eigen::PlainObjectBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)&local_88,uVar13,1);
  }
  IVar11 = local_88.m_rows;
  pfVar1 = local_88.m_data;
  if (0 < local_88.m_rows) {
    uVar13 = 0;
    do {
      iVar12 = rand();
      pfVar1[uVar13] = ((float)iVar12 + (float)iVar12) * 4.656613e-10 + -1.0;
      uVar13 = uVar13 + 1;
    } while (IVar11 != uVar13);
  }
  Eigen::DenseStorage<float,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<float,__1,__1,_1,_0> *)this,&local_88);
  if (local_58 != 0) {
    sVar15 = 0;
    do {
      local_78.m_storage.m_data = (float *)0x0;
      local_78.m_storage.m_rows = 0;
      Eigen::PlainObjectBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::resize
                (&local_78,energyMatrix->m_innerSize,1);
      if (local_78.m_storage.m_rows != energyMatrix->m_innerSize) {
        Eigen::PlainObjectBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::resize
                  (&local_78,energyMatrix->m_innerSize,1);
      }
      if (0 < local_78.m_storage.m_rows) {
        memset(local_78.m_storage.m_data,0,local_78.m_storage.m_rows << 2);
      }
      local_5c = 1.0;
      Eigen::internal::
      sparse_time_dense_product_impl<Eigen::SparseMatrix<float,_0,_int>,_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_float,_0,_true>
      ::run(energyMatrix,(Matrix<float,__1,_1,_0,__1,_1> *)&local_88,
            (Matrix<float,__1,_1,_0,__1,_1> *)&local_78,&local_5c);
      PositiveDefiniteSolver<float>::solve
                (&local_50,(Vector<float> *)this,(Vector<float> *)&local_78);
      if (local_78.m_storage.m_data != (float *)0x0) {
        free(*(void **)(local_78.m_storage.m_data + -2));
      }
      anon_unknown_1::normalize<float>((Vector<float> *)this,massMatrix);
      lVar3 = *(long *)this;
      if (local_88.m_rows != *(ulong *)(this + 8)) {
        Eigen::PlainObjectBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::resize
                  ((PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)&local_88,
                   *(ulong *)(this + 8),1);
      }
      uVar13 = local_88.m_rows + 0xf;
      if (-1 < local_88.m_rows) {
        uVar13 = local_88.m_rows;
      }
      uVar13 = uVar13 & 0xfffffffffffffff0;
      if (0xf < local_88.m_rows) {
        lVar14 = 0;
        do {
          puVar2 = (undefined8 *)(lVar3 + lVar14 * 4);
          uVar4 = puVar2[1];
          uVar5 = puVar2[2];
          uVar6 = puVar2[3];
          uVar7 = puVar2[4];
          uVar8 = puVar2[5];
          uVar9 = puVar2[6];
          uVar10 = puVar2[7];
          pfVar1 = local_88.m_data + lVar14;
          *(undefined8 *)pfVar1 = *puVar2;
          *(undefined8 *)(pfVar1 + 2) = uVar4;
          *(undefined8 *)(pfVar1 + 4) = uVar5;
          *(undefined8 *)(pfVar1 + 6) = uVar6;
          *(undefined8 *)(pfVar1 + 8) = uVar7;
          *(undefined8 *)(pfVar1 + 10) = uVar8;
          *(undefined8 *)(pfVar1 + 0xc) = uVar9;
          *(undefined8 *)(pfVar1 + 0xe) = uVar10;
          lVar14 = lVar14 + 0x10;
        } while (lVar14 < (long)uVar13);
      }
      if ((long)uVar13 < local_88.m_rows) {
        do {
          local_88.m_data[uVar13] = *(float *)(lVar3 + uVar13 * 4);
          uVar13 = uVar13 + 1;
        } while (local_88.m_rows != uVar13);
      }
      sVar15 = sVar15 + 1;
    } while (sVar15 != local_58);
  }
  if (local_88.m_data != (float *)0x0) {
    free(*(void **)(local_88.m_data + -2));
  }
  PositiveDefiniteSolver<float>::~PositiveDefiniteSolver(&local_50);
  VVar16.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  VVar16.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (float *)this;
  return (Vector<float>)
         VVar16.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

Vector<T> largestEigenvector(SparseMatrix<T>& energyMatrix, SparseMatrix<T>& massMatrix, size_t nIterations) {

  size_t N = massMatrix.rows();
  PositiveDefiniteSolver<T> solver(massMatrix);

  Vector<T> u = Vector<T>::Random(N);
  Vector<T> x = u;
  for (size_t iIter = 0; iIter < nIterations; iIter++) {
    solver.solve(x, energyMatrix * u);
    normalize(x, massMatrix);
    u = x;
  }

  return x;
}